

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gomory-hu-tree.c
# Opt level: O0

greatest_test_res random_symm_networks(void)

{
  flow_t fVar1;
  greatest_test_res gVar2;
  flow_t fVar3;
  NodePair NVar4;
  greatest_test_res greatest_RES_1;
  greatest_test_res greatest_RES;
  flow_t max_flow2;
  flow_t max_flow1;
  int32_t sink_vertex;
  int32_t source_vertex;
  NodePair st_pair;
  MaxFlowResult result2;
  MaxFlowResult result1;
  MaxFlow mf;
  FlowNetwork net;
  int local_10;
  int32_t try_it;
  int32_t nnodes;
  
  local_10 = 2;
  do {
    if (8 < local_10) {
      greatest_info.msg = (char *)0x0;
      return GREATEST_TEST_RES_PASS;
    }
    for (net.caps._4_4_ = 0; net.caps._4_4_ < 0x200; net.caps._4_4_ = net.caps._4_4_ + 1) {
      memset((void *)((long)&mf.payload + 0x28),0,0x10);
      memset(&result1.colors,0,0x40);
      memset(&result2.colors,0,0x18);
      memset(&st_pair,0,0x18);
      flow_network_create((FlowNetwork *)((long)&mf.payload + 0x28),local_10);
      max_flow_create((MaxFlow *)&result1.colors,local_10,MAXFLOW_ALGO_PUSH_RELABEL);
      max_flow_result_create((MaxFlowResult *)&result2.colors,local_10);
      max_flow_result_create((MaxFlowResult *)&st_pair,local_10);
      NVar4 = make_random_node_pair(local_10);
      init_symm_random_flownet((FlowNetwork *)((long)&mf.payload + 0x28));
      sink_vertex = NVar4.u;
      source_vertex = NVar4.v;
      fVar1 = max_flow_single_pair
                        ((FlowNetwork *)((long)&mf.payload + 0x28),(MaxFlow *)&result1.colors,
                         sink_vertex,source_vertex,(MaxFlowResult *)&result2.colors);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (fVar1 != result1.s) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-gomory-hu-tree.c"
        ;
        greatest_info.fail_line = 0x6d;
        greatest_info.msg = "max_flow1 != result1.maxflow";
        if ((greatest_info.flags & 4) == 0) {
          greatest_info.fail_line = 0x6d;
          return GREATEST_TEST_RES_FAIL;
        }
        abort();
      }
      gVar2 = validate_with_slow_max_flow
                        ((FlowNetwork *)((long)&mf.payload + 0x28),sink_vertex,source_vertex,
                         (MaxFlowResult *)&result2.colors);
      if (gVar2 != GREATEST_TEST_RES_PASS) {
        return gVar2;
      }
      fVar3 = max_flow_single_pair
                        ((FlowNetwork *)((long)&mf.payload + 0x28),(MaxFlow *)&result1.colors,
                         source_vertex,sink_vertex,(MaxFlowResult *)&st_pair);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (fVar3 != result2.s) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-gomory-hu-tree.c"
        ;
        greatest_info.fail_line = 0x75;
        greatest_info.msg = "max_flow2 != result2.maxflow";
        if ((greatest_info.flags & 4) == 0) {
          greatest_info.fail_line = 0x75;
          return GREATEST_TEST_RES_FAIL;
        }
        abort();
      }
      gVar2 = validate_with_slow_max_flow
                        ((FlowNetwork *)((long)&mf.payload + 0x28),source_vertex,sink_vertex,
                         (MaxFlowResult *)&st_pair);
      if (gVar2 != GREATEST_TEST_RES_PASS) {
        return gVar2;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      if (fVar1 != fVar3) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-gomory-hu-tree.c"
        ;
        greatest_info.fail_line = 0x7a;
        greatest_info.msg = "max_flow1 != max_flow2";
        if ((greatest_info.flags & 4) == 0) {
          greatest_info.fail_line = 0x7a;
          return GREATEST_TEST_RES_FAIL;
        }
        abort();
      }
      flow_network_destroy((FlowNetwork *)((long)&mf.payload + 0x28));
      max_flow_destroy((MaxFlow *)&result1.colors);
      max_flow_result_destroy((MaxFlowResult *)&result2.colors);
      max_flow_result_destroy((MaxFlowResult *)&st_pair);
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

TEST random_symm_networks(void) {
    for (int32_t nnodes = 2; nnodes <= 8; nnodes++) {
        for (int32_t try_it = 0; try_it < 512; try_it++) {
            FlowNetwork net = {0};
            MaxFlow mf = {0};
            MaxFlowResult result1 = {0};
            MaxFlowResult result2 = {0};

            flow_network_create(&net, nnodes);
            max_flow_create(&mf, nnodes, MAXFLOW_ALGO_PUSH_RELABEL);
            max_flow_result_create(&result1, nnodes);
            max_flow_result_create(&result2, nnodes);

            NodePair st_pair = make_random_node_pair(nnodes);
            init_symm_random_flownet(&net);

            int32_t source_vertex = st_pair.u;
            int32_t sink_vertex = st_pair.v;

            flow_t max_flow1 = 0;
            flow_t max_flow2 = 0;

            // Validate flow symmetry between max flows (s, t) vs (t, s)
            {
                max_flow1 = max_flow_single_pair(&net, &mf, source_vertex,
                                                 sink_vertex, &result1);

                ASSERT_EQ(max_flow1, result1.maxflow);
                CHECK_CALL(validate_with_slow_max_flow(&net, source_vertex,
                                                       sink_vertex, &result1));
            }

            {
                max_flow2 = max_flow_single_pair(&net, &mf, sink_vertex,
                                                 source_vertex, &result2);
                ASSERT_EQ(max_flow2, result2.maxflow);
                CHECK_CALL(validate_with_slow_max_flow(
                    &net, sink_vertex, source_vertex, &result2));
            }

            ASSERT_EQ(max_flow1, max_flow2);

            flow_network_destroy(&net);
            max_flow_destroy(&mf);
            max_flow_result_destroy(&result1);
            max_flow_result_destroy(&result2);
        }
    }

    PASS();
}